

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EverCrypt_Hash.c
# Opt level: O0

void EverCrypt_Hash_Incremental_hash_256(uint8_t *output,uint8_t *input,uint32_t input_len)

{
  uint len;
  uint8_t *rest;
  uint32_t rest_len;
  uint8_t *blocks;
  uint32_t blocks_len;
  uint32_t blocks_n;
  uint8_t *rest0;
  uint32_t rest_len0;
  uint8_t *blocks0;
  uint32_t local_e0;
  uint32_t blocks_len0;
  uint32_t blocks_n1;
  uint32_t blocks_n0;
  uint32_t *s;
  uint32_t x_7;
  uint32_t *os_7;
  uint32_t x_6;
  uint32_t *os_6;
  uint32_t x_5;
  uint32_t *os_5;
  uint32_t x_4;
  uint32_t *os_4;
  uint32_t x_3;
  uint32_t *os_3;
  uint32_t x_2;
  uint32_t *os_2;
  uint32_t x_1;
  uint32_t *os_1;
  uint32_t x;
  uint32_t *os;
  uint32_t local_48;
  uint32_t i;
  uint32_t st [8];
  uint32_t input_len_local;
  uint8_t *input_local;
  uint8_t *output_local;
  
  memset(&local_48,0,0x20);
  local_48 = 0x6a09e667;
  i = 0xbb67ae85;
  st[0] = 0x3c6ef372;
  st[1] = 0xa54ff53a;
  st[2] = 0x510e527f;
  st[3] = 0x9b05688c;
  st[4] = 0x1f83d9ab;
  st[5] = 0x5be0cd19;
  local_e0 = input_len >> 6;
  if (((input_len & 0x3f) == 0) && (local_e0 != 0)) {
    local_e0 = local_e0 - 1;
  }
  len = input_len + local_e0 * -0x40;
  EverCrypt_Hash_update_multi_256(&local_48,input,local_e0);
  Hacl_Hash_SHA2_sha256_update_last
            ((ulong)(local_e0 * 0x40) + (ulong)len,len,input + local_e0 * 0x40,&local_48);
  Hacl_Hash_SHA2_sha256_finish(&local_48,output);
  return;
}

Assistant:

void EverCrypt_Hash_Incremental_hash_256(uint8_t *output, uint8_t *input, uint32_t input_len)
{
  uint32_t st[8U] = { 0U };
  KRML_MAYBE_FOR8(i,
    0U,
    8U,
    1U,
    uint32_t *os = st;
    uint32_t x = Hacl_Hash_SHA2_h256[i];
    os[i] = x;);
  uint32_t *s = st;
  uint32_t blocks_n0 = input_len / 64U;
  uint32_t blocks_n1;
  if (input_len % 64U == 0U && blocks_n0 > 0U)
  {
    blocks_n1 = blocks_n0 - 1U;
  }
  else
  {
    blocks_n1 = blocks_n0;
  }
  uint32_t blocks_len0 = blocks_n1 * 64U;
  uint8_t *blocks0 = input;
  uint32_t rest_len0 = input_len - blocks_len0;
  uint8_t *rest0 = input + blocks_len0;
  uint32_t blocks_n = blocks_n1;
  uint32_t blocks_len = blocks_len0;
  uint8_t *blocks = blocks0;
  uint32_t rest_len = rest_len0;
  uint8_t *rest = rest0;
  EverCrypt_Hash_update_multi_256(s, blocks, blocks_n);
  Hacl_Hash_SHA2_sha256_update_last((uint64_t)blocks_len + (uint64_t)rest_len,
    rest_len,
    rest,
    s);
  Hacl_Hash_SHA2_sha256_finish(s, output);
}